

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_ptr.hpp
# Opt level: O2

void duckdb::
     unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>::
     AssertNotNull(bool null)

{
  InternalException *this;
  undefined7 in_register_00000039;
  allocator local_39;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000039,null) == 0) {
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Attempted to dereference unique_ptr that is NULL!",&local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline void AssertNotNull(const bool null) {
#if defined(DUCKDB_DEBUG_NO_SAFETY) || defined(DUCKDB_CLANG_TIDY)
		return;
#else
		if (DUCKDB_UNLIKELY(null)) {
			throw duckdb::InternalException("Attempted to dereference unique_ptr that is NULL!");
		}
#endif
	}